

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYRef<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLogLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYRef<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXsYRef<signed_char> *pGVar8;
  TransformerLogLog *pTVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  ImPlotContext *pIVar15;
  ImPlotContext *pIVar16;
  int iVar17;
  ImDrawIdx IVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  float fVar24;
  float fVar25;
  undefined1 auVar23 [16];
  float fVar26;
  float fVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  pIVar15 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar17 = pGVar8->Count;
  dVar22 = pGVar8->YRef;
  dVar21 = log10((double)(int)pGVar8->Xs
                              [(long)(((pGVar8->Offset + prim) % iVar17 + iVar17) % iVar17) *
                               (long)pGVar8->Stride] / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar15->CurrentPlot;
  dVar1 = pIVar15->LogDenX;
  dVar2 = (pIVar10->XAxis).Range.Min;
  dVar3 = (pIVar10->XAxis).Range.Max;
  dVar22 = log10(dVar22 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  pIVar16 = GImPlot;
  iVar17 = pTVar9->YAxis;
  pIVar10 = pIVar15->CurrentPlot;
  pGVar8 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar5 = pGVar8->Count;
  auVar31._8_8_ = pIVar15->LogDenY[iVar17];
  auVar31._0_8_ = dVar1;
  auVar27._8_8_ = dVar22;
  auVar27._0_8_ = dVar21;
  dVar22 = pGVar8->YRef;
  auVar28 = divpd(auVar27,auVar31);
  dVar1 = pIVar10->YAxis[iVar17].Range.Min;
  IVar4 = pIVar15->PixelRange[iVar17].Min;
  fVar19 = (float)(pIVar15->Mx *
                   (((double)(float)auVar28._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar4.x);
  fVar24 = (float)(pIVar15->My[iVar17] *
                   (((double)(float)auVar28._8_8_ * (pIVar10->YAxis[iVar17].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  dVar21 = log10((double)(int)pGVar8->Xs
                              [(long)(((prim + pGVar8->Offset) % iVar5 + iVar5) % iVar5) *
                               (long)pGVar8->Stride] / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar16->CurrentPlot;
  dVar1 = pIVar16->LogDenX;
  dVar2 = (pIVar10->XAxis).Range.Min;
  dVar3 = (pIVar10->XAxis).Range.Max;
  auVar23._0_8_ = log10(dVar22 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  iVar17 = pTVar9->YAxis;
  auVar23._8_8_ = dVar21;
  auVar13._8_4_ = SUB84(dVar1,0);
  auVar13._0_8_ = pIVar16->LogDenY[iVar17];
  auVar13._12_4_ = (int)((ulong)dVar1 >> 0x20);
  auVar28 = divpd(auVar23,auVar13);
  pIVar10 = pIVar16->CurrentPlot;
  dVar22 = pIVar10->YAxis[iVar17].Range.Min;
  IVar4 = pIVar16->PixelRange[iVar17].Min;
  fVar20 = (float)(pIVar16->My[iVar17] *
                   (((double)(float)auVar28._0_8_ * (pIVar10->YAxis[iVar17].Range.Max - dVar22) +
                    dVar22) - dVar22) + (double)IVar4.y);
  fVar25 = (float)(pIVar16->Mx *
                   (((double)(float)auVar28._8_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar4.x);
  auVar32._0_4_ = ~-(uint)(fVar25 <= fVar19) & (uint)fVar25;
  auVar32._4_4_ = ~-(uint)(fVar20 <= fVar24) & (uint)fVar20;
  auVar32._8_4_ = ~-(uint)(fVar19 < fVar25) & (uint)fVar25;
  auVar32._12_4_ = ~-(uint)(fVar24 < fVar20) & (uint)fVar20;
  auVar28._4_4_ = (uint)fVar24 & -(uint)(fVar20 <= fVar24);
  auVar28._0_4_ = (uint)fVar19 & -(uint)(fVar25 <= fVar19);
  auVar28._8_4_ = (uint)fVar19 & -(uint)(fVar19 < fVar25);
  auVar28._12_4_ = (uint)fVar24 & -(uint)(fVar24 < fVar20);
  auVar32 = auVar32 | auVar28;
  fVar26 = (cull_rect->Min).y;
  auVar14._4_8_ = auVar32._8_8_;
  auVar14._0_4_ = -(uint)(auVar32._4_4_ < fVar26);
  auVar33._0_8_ = auVar14._0_8_ << 0x20;
  auVar33._8_4_ = -(uint)(auVar32._8_4_ < (cull_rect->Max).x);
  auVar33._12_4_ = -(uint)(auVar32._12_4_ < (cull_rect->Max).y);
  auVar34._4_4_ = -(uint)(fVar26 < auVar32._4_4_);
  auVar34._0_4_ = -(uint)((cull_rect->Min).x < auVar32._0_4_);
  auVar34._8_8_ = auVar33._8_8_;
  iVar17 = movmskps((int)cull_rect,auVar34);
  if (iVar17 == 0xf) {
    IVar6 = this->Col;
    IVar4 = *uv;
    fVar26 = fVar20 - fVar24;
    fVar29 = fVar25 - fVar19;
    fVar30 = fVar29 * fVar29 + fVar26 * fVar26;
    if (0.0 < fVar30) {
      fVar30 = 1.0 / SQRT(fVar30);
      fVar26 = fVar26 * fVar30;
      fVar29 = fVar29 * fVar30;
    }
    fVar30 = this->Weight * 0.5;
    pIVar11 = DrawList->_VtxWritePtr;
    fVar26 = fVar30 * fVar26;
    fVar30 = fVar30 * fVar29;
    (pIVar11->pos).x = fVar26 + fVar19;
    (pIVar11->pos).y = fVar24 - fVar30;
    (pIVar11->uv).x = IVar4.x;
    (pIVar11->uv).y = IVar4.y;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar6;
    pIVar11[1].pos.x = fVar26 + fVar25;
    pIVar11[1].pos.y = fVar20 - fVar30;
    pIVar11[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar25 - fVar26;
    pIVar11[2].pos.y = fVar30 + fVar20;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    pIVar11[3].pos.x = fVar19 - fVar26;
    pIVar11[3].pos.y = fVar30 + fVar24;
    pIVar11[3].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar18 = (ImDrawIdx)uVar7;
    *pIVar12 = IVar18;
    pIVar12[1] = IVar18 + 1;
    pIVar12[2] = IVar18 + 2;
    pIVar12[3] = IVar18;
    pIVar12[4] = IVar18 + 2;
    pIVar12[5] = IVar18 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  return (char)iVar17 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }